

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O0

void Sim_SymmsStructCompute(Abc_Ntk_t *pNtk,Vec_Ptr_t *vMatrs,Vec_Ptr_t *vSuppFun)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int *pMap_00;
  Extra_BitMat_t *pMatSymm;
  uint *pSupport;
  void *pvVar5;
  int local_3c;
  int i;
  int *pMap;
  Abc_Obj_t *pTemp;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vSuppFun_local;
  Vec_Ptr_t *vMatrs_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkCiNum(pNtk);
  if (0xffff < iVar1 + 10) {
    __assert_fail("Abc_NtkCiNum(pNtk) + 10 < (1<<16)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simSymStr.c"
                  ,0x43,"void Sim_SymmsStructCompute(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  pVVar2 = Sim_ComputeStrSupp(pNtk);
  pNtk->vSupps = pVVar2;
  for (local_3c = 0; iVar1 = Abc_NtkCiNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = Abc_NtkCi(pNtk,local_3c);
    pAVar4 = (Abc_Obj_t *)Vec_IntAlloc(0);
    (pAVar3->field_6).pCopy = pAVar4;
  }
  pMap_00 = Sim_SymmsCreateMap(pNtk);
  pVVar2 = Abc_NtkDfs(pNtk,0);
  for (local_3c = 0; iVar1 = Vec_PtrSize(pVVar2), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(pVVar2,local_3c);
    Sim_SymmsStructComputeOne(pNtk,pAVar3,pMap_00);
  }
  for (local_3c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = Abc_NtkCo(pNtk,local_3c);
    pAVar3 = Abc_ObjFanin0(pAVar3);
    iVar1 = Abc_ObjIsCi(pAVar3);
    if ((iVar1 == 0) && (iVar1 = Abc_AigNodeIsConst(pAVar3), iVar1 == 0)) {
      pMatSymm = (Extra_BitMat_t *)Vec_PtrEntry(vMatrs,local_3c);
      pAVar3 = (pAVar3->field_6).pCopy;
      pSupport = (uint *)Vec_PtrEntry(vSuppFun,local_3c);
      Sim_SymmsTransferToMatrix(pMatSymm,(Vec_Int_t *)pAVar3,pSupport);
    }
  }
  Sim_UtilInfoFree(pNtk->vSupps);
  pNtk->vSupps = (Vec_Ptr_t *)0x0;
  for (local_3c = 0; iVar1 = Abc_NtkCiNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = Abc_NtkCi(pNtk,local_3c);
    Vec_IntFree((Vec_Int_t *)(pAVar3->field_6).pCopy);
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(pVVar2), local_3c < iVar1; local_3c = local_3c + 1) {
    pvVar5 = Vec_PtrEntry(pVVar2,local_3c);
    Vec_IntFree(*(Vec_Int_t **)((long)pvVar5 + 0x40));
  }
  Vec_PtrFree(pVVar2);
  if (pMap_00 != (int *)0x0) {
    free(pMap_00);
  }
  return;
}

Assistant:

void Sim_SymmsStructCompute( Abc_Ntk_t * pNtk, Vec_Ptr_t * vMatrs, Vec_Ptr_t * vSuppFun )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pTemp;
    int * pMap, i;

    assert( Abc_NtkCiNum(pNtk) + 10 < (1<<16) );

    // get the structural support
    pNtk->vSupps = Sim_ComputeStrSupp( pNtk );
    // set elementary info for the CIs
    Abc_NtkForEachCi( pNtk, pTemp, i )
        SIM_SET_SYMMS( pTemp, Vec_IntAlloc(0) );
    // create the map of CI ids into their numbers
    pMap = Sim_SymmsCreateMap( pNtk );
    // collect the nodes in the TFI cone of this output
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pTemp, i )
    {
//        if ( Abc_NodeIsConst(pTemp) )
//            continue;
        Sim_SymmsStructComputeOne( pNtk, pTemp, pMap );
    }
    // collect the results for the COs;
    Abc_NtkForEachCo( pNtk, pTemp, i )
    {
//printf( "Output %d:\n", i );
        pTemp = Abc_ObjFanin0(pTemp);
        if ( Abc_ObjIsCi(pTemp) || Abc_AigNodeIsConst(pTemp) )
            continue;
        Sim_SymmsTransferToMatrix( (Extra_BitMat_t *)Vec_PtrEntry(vMatrs, i), SIM_READ_SYMMS(pTemp), (unsigned *)Vec_PtrEntry(vSuppFun, i) );
    }
    // clean the intermediate results
    Sim_UtilInfoFree( pNtk->vSupps );
    pNtk->vSupps = NULL;
    Abc_NtkForEachCi( pNtk, pTemp, i )
        Vec_IntFree( SIM_READ_SYMMS(pTemp) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pTemp, i )
//        if ( !Abc_NodeIsConst(pTemp) )
            Vec_IntFree( SIM_READ_SYMMS(pTemp) );
    Vec_PtrFree( vNodes );
    ABC_FREE( pMap );
}